

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

int archive_write_zip_header(archive_write *a,archive_entry *entry)

{
  undefined8 *puVar1;
  long lVar2;
  archive *a_00;
  short sVar3;
  mode_t mVar4;
  wchar_t wVar5;
  undefined4 uVar6;
  int iVar7;
  uint uVar8;
  wchar_t wVar9;
  archive_string_conv *sc;
  int64_t iVar10;
  archive_entry *paVar11;
  int *piVar12;
  char *pcVar13;
  char *pcVar14;
  size_t sVar15;
  uchar *puVar16;
  time_t tVar17;
  undefined4 *puVar18;
  void *pvVar19;
  byte bVar20;
  short sVar21;
  short sVar22;
  archive_entry *in_RSI;
  archive *in_RDI;
  int included;
  uchar *external_info;
  uchar *zip64_start;
  size_t len;
  char *p;
  int version_needed;
  mode_t type;
  int64_t size;
  int ret2;
  int ret;
  archive_string_conv *sconv;
  size_t slink_size;
  char *slink;
  size_t filename_length;
  uchar *cd_extra;
  uchar *e;
  zip_conflict *zip;
  uchar local_extra [128];
  uchar local_header [32];
  archive_entry *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  archive_entry *in_stack_fffffffffffffe58;
  archive_entry *in_stack_fffffffffffffe60;
  archive_entry *in_stack_fffffffffffffe68;
  archive_write *in_stack_fffffffffffffe80;
  archive_write *paVar23;
  long local_118;
  uint16_t local_108;
  int local_f8;
  size_t sVar24;
  char *__s;
  archive_write *local_c8;
  undefined2 local_b8;
  undefined1 auStack_b6 [2];
  byte local_b4;
  undefined1 auStack_b3 [123];
  undefined4 local_38;
  undefined1 auStack_34 [2];
  undefined1 auStack_32 [2];
  undefined1 auStack_30 [2];
  undefined1 auStack_2e [4];
  undefined1 auStack_2a [4];
  undefined1 auStack_26 [4];
  undefined1 auStack_22 [4];
  undefined1 auStack_1e [2];
  undefined1 auStack_1c [4];
  archive_entry *local_18;
  archive *local_10;
  int local_4;
  
  puVar1 = *(undefined8 **)&in_RDI[1].current_codepage;
  __s = (char *)0x0;
  sVar24 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  sc = get_sconv((archive_write *)in_stack_fffffffffffffe48,(zip_conflict *)0x18fc3b);
  local_f8 = 0;
  mVar4 = archive_entry_filetype(local_18);
  if (((mVar4 != 0x8000) && (mVar4 != 0x4000)) && (mVar4 != 0xa000)) {
    archive_set_error(local_10,-1,"Filetype not supported");
    return -0x19;
  }
  if ((*(uint *)(puVar1 + 0x15) & 1) != 0) {
    wVar5 = archive_entry_size_is_set(local_18);
    if ((wVar5 != L'\0') && (iVar10 = archive_entry_size(local_18), 0xffffffff < iVar10)) {
      archive_set_error(local_10,-1,"Files > 4GB require Zip64 extensions");
      return -0x19;
    }
    if (0xffffffff < (long)puVar1[0x11]) {
      archive_set_error(local_10,-1,"Archives > 4GB require Zip64 extensions");
      return -0x19;
    }
  }
  if (mVar4 != 0x8000) {
    archive_entry_set_size(local_18,0);
  }
  *puVar1 = puVar1[0x11];
  puVar1[5] = 0x7fffffffffffffff;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  *(undefined4 *)(puVar1 + 8) = 0;
  *(undefined4 *)((long)puVar1 + 0x44) = 0;
  uVar6 = (*(code *)puVar1[0xc])(0);
  *(undefined4 *)(puVar1 + 7) = uVar6;
  if (puVar1[6] != 0) {
    archive_entry_free((archive_entry *)0x18fe5e);
    puVar1[6] = 0;
  }
  paVar11 = archive_entry_clone(in_stack_fffffffffffffe68);
  puVar1[6] = paVar11;
  if (puVar1[6] == 0) {
    archive_set_error(local_10,0xc,"Can\'t allocate zip header data");
    local_4 = -0x1e;
  }
  else {
    if (sc != (archive_string_conv *)0x0) {
      wVar5 = _archive_entry_pathname_l
                        (in_stack_fffffffffffffe60,(char **)in_stack_fffffffffffffe58,
                         (size_t *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         (archive_string_conv *)in_stack_fffffffffffffe48);
      if (wVar5 != L'\0') {
        piVar12 = __errno_location();
        a_00 = local_10;
        if (*piVar12 == 0xc) {
          archive_set_error(local_10,0xc,"Can\'t allocate memory for Pathname");
          return -0x1e;
        }
        pcVar13 = archive_entry_pathname(in_stack_fffffffffffffe48);
        pcVar14 = archive_string_conversion_charset_name(sc);
        archive_set_error(a_00,0x54,"Can\'t translate Pathname \'%s\' to %s",pcVar13,pcVar14);
        local_f8 = -0x14;
      }
      if (local_118 != 0) {
        archive_entry_set_pathname
                  ((archive_entry *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   (char *)in_stack_fffffffffffffe48);
      }
      if (mVar4 == 0xa000) {
        wVar5 = _archive_entry_symlink_l
                          (in_stack_fffffffffffffe58,
                           (char **)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                           (size_t *)in_stack_fffffffffffffe48,(archive_string_conv *)0x18ffed);
        if (wVar5 == L'\0') {
          if (local_118 != 0) {
            archive_entry_set_symlink
                      ((archive_entry *)
                       CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       (char *)in_stack_fffffffffffffe48);
          }
        }
        else {
          piVar12 = __errno_location();
          if (*piVar12 == 0xc) {
            archive_set_error(local_10,0xc,"Can\'t allocate memory  for Symlink");
            return -0x1e;
          }
        }
      }
    }
    pcVar13 = archive_entry_pathname(in_stack_fffffffffffffe48);
    iVar7 = is_all_ascii(pcVar13);
    if (iVar7 == 0) {
      if (puVar1[0x12] == 0) {
        pcVar13 = nl_langinfo(0xe);
        iVar7 = strcmp(pcVar13,"UTF-8");
        if (iVar7 == 0) {
          *(uint *)(puVar1 + 8) = *(uint *)(puVar1 + 8) | 0x800;
        }
      }
      else {
        pcVar13 = archive_string_conversion_charset_name((archive_string_conv *)puVar1[0x12]);
        iVar7 = strcmp(pcVar13,"UTF-8");
        if (iVar7 == 0) {
          *(uint *)(puVar1 + 8) = *(uint *)(puVar1 + 8) | 0x800;
        }
      }
    }
    sVar15 = path_length(in_stack_fffffffffffffe58);
    if (mVar4 == 0xa000) {
      __s = archive_entry_symlink(in_stack_fffffffffffffe48);
      if (__s == (char *)0x0) {
        sVar24 = 0;
      }
      else {
        sVar24 = strlen(__s);
      }
      puVar1[5] = sVar24;
      puVar1[1] = sVar24;
      puVar1[2] = sVar24;
      uVar6 = (*(code *)puVar1[0xc])(*(undefined4 *)(puVar1 + 7),__s,sVar24);
      *(undefined4 *)(puVar1 + 7) = uVar6;
      *(undefined4 *)((long)puVar1 + 0x3c) = 0;
      local_108 = 0x14;
    }
    else if (mVar4 == 0x8000) {
      wVar5 = archive_entry_size_is_set((archive_entry *)puVar1[6]);
      if (wVar5 == L'\0') {
        *(undefined4 *)((long)puVar1 + 0x3c) = 8;
        *(uint *)(puVar1 + 8) = *(uint *)(puVar1 + 8) | 8;
        if ((*(uint *)(puVar1 + 0x15) & 1) == 0) {
          *(undefined4 *)((long)puVar1 + 0x44) = 1;
          local_108 = 0x2d;
        }
        else if (*(int *)((long)puVar1 + 0x3c) == 0) {
          local_108 = 10;
        }
        else {
          local_108 = 0x14;
        }
      }
      else {
        iVar10 = archive_entry_size((archive_entry *)puVar1[6]);
        puVar1[5] = iVar10;
        *(undefined4 *)((long)puVar1 + 0x3c) = *(undefined4 *)(puVar1 + 0x14);
        if (*(int *)((long)puVar1 + 0x3c) == -1) {
          *(undefined4 *)((long)puVar1 + 0x3c) = 8;
        }
        if (*(int *)((long)puVar1 + 0x3c) == 0) {
          puVar1[1] = iVar10;
          puVar1[2] = iVar10;
          local_108 = 10;
        }
        else {
          puVar1[2] = iVar10;
          local_108 = 0x14;
        }
        if (((*(uint *)(puVar1 + 0x15) & 2) != 0) || (0xffffffff < (long)puVar1[2])) {
          *(undefined4 *)((long)puVar1 + 0x44) = 1;
          local_108 = 0x2d;
        }
        *(uint *)(puVar1 + 8) = *(uint *)(puVar1 + 8) | 8;
      }
    }
    else {
      *(undefined4 *)((long)puVar1 + 0x3c) = 0;
      puVar1[5] = 0;
      local_108 = 0x14;
    }
    memset(&local_38,0,0x20);
    local_38 = 0x4034b50;
    archive_le16enc(auStack_34,local_108);
    archive_le16enc(auStack_32,(uint16_t)*(undefined4 *)(puVar1 + 8));
    archive_le16enc(auStack_30,(uint16_t)*(undefined4 *)((long)puVar1 + 0x3c));
    archive_entry_mtime((archive_entry *)puVar1[6]);
    uVar8 = dos_time(CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    archive_le32enc(auStack_2e,uVar8);
    archive_le32enc(auStack_2a,*(uint32_t *)(puVar1 + 7));
    if (*(int *)((long)puVar1 + 0x44) == 0) {
      archive_le32enc(auStack_26,(uint32_t)puVar1[1]);
      archive_le32enc(auStack_22,(uint32_t)puVar1[2]);
    }
    else {
      archive_le32enc(auStack_26,0xffffffff);
      archive_le32enc(auStack_22,0xffffffff);
    }
    archive_le16enc(auStack_1e,(uint16_t)sVar15);
    puVar16 = cd_alloc((zip_conflict *)in_stack_fffffffffffffe58,
                       CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    puVar1[10] = puVar16;
    puVar1[0x10] = puVar1[0x10] + 1;
    memset((void *)puVar1[10],0,0x2e);
    *(undefined4 *)puVar1[10] = 0x2014b50;
    archive_le16enc((void *)(puVar1[10] + 4),local_108 + 0x300);
    archive_le16enc((void *)(puVar1[10] + 6),local_108);
    archive_le16enc((void *)(puVar1[10] + 8),(uint16_t)*(undefined4 *)(puVar1 + 8));
    archive_le16enc((void *)(puVar1[10] + 10),(uint16_t)*(undefined4 *)((long)puVar1 + 0x3c));
    paVar11 = (archive_entry *)(puVar1[10] + 0xc);
    archive_entry_mtime((archive_entry *)puVar1[6]);
    uVar8 = dos_time(CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    archive_le32enc(paVar11,uVar8);
    archive_le16enc((void *)(puVar1[10] + 0x1c),(uint16_t)sVar15);
    lVar2 = puVar1[10];
    mVar4 = archive_entry_mode((archive_entry *)puVar1[6]);
    archive_le32enc((void *)(lVar2 + 0x26),mVar4 << 0x10);
    cd_alloc((zip_conflict *)in_stack_fffffffffffffe58,
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    copy_path(in_stack_fffffffffffffe60,(uchar *)in_stack_fffffffffffffe58);
    memset(&local_b8,0,0x80);
    local_b8 = 0x5455;
    wVar5 = archive_entry_mtime_is_set(local_18);
    sVar3 = 0;
    if (wVar5 != L'\0') {
      sVar3 = 4;
    }
    wVar5 = archive_entry_atime_is_set(local_18);
    sVar21 = 0;
    if (wVar5 != L'\0') {
      sVar21 = 4;
    }
    wVar5 = archive_entry_ctime_is_set(local_18);
    sVar22 = 0;
    if (wVar5 != L'\0') {
      sVar22 = 4;
    }
    archive_le16enc(auStack_b6,sVar3 + 1 + sVar21 + sVar22);
    wVar5 = archive_entry_mtime_is_set(local_18);
    wVar9 = archive_entry_atime_is_set(local_18);
    bVar20 = 0;
    if (wVar9 != L'\0') {
      bVar20 = 2;
    }
    wVar9 = archive_entry_ctime_is_set(local_18);
    local_b4 = 0;
    if (wVar9 != L'\0') {
      local_b4 = 4;
    }
    local_b4 = wVar5 != L'\0' | bVar20 | local_b4;
    paVar23 = (archive_write *)auStack_b3;
    wVar5 = archive_entry_mtime_is_set(local_18);
    local_c8 = paVar23;
    if (wVar5 != L'\0') {
      tVar17 = archive_entry_mtime(local_18);
      archive_le32enc(paVar23,(uint32_t)tVar17);
      local_c8 = (archive_write *)(auStack_b3 + 4);
      in_stack_fffffffffffffe80 = paVar23;
    }
    wVar5 = archive_entry_atime_is_set(local_18);
    if (wVar5 != L'\0') {
      tVar17 = archive_entry_atime(local_18);
      archive_le32enc(local_c8,(uint32_t)tVar17);
      local_c8 = (archive_write *)&(local_c8->archive).state;
    }
    wVar5 = archive_entry_ctime_is_set(local_18);
    if (wVar5 != L'\0') {
      tVar17 = archive_entry_ctime(local_18);
      archive_le32enc(local_c8,(uint32_t)tVar17);
      local_c8 = (archive_write *)&(local_c8->archive).state;
    }
    (local_c8->archive).magic = 0xb7875;
    *(undefined1 *)&(local_c8->archive).state = 1;
    pvVar19 = (void *)((long)&(local_c8->archive).state + 2);
    *(undefined1 *)((long)&(local_c8->archive).state + 1) = 4;
    iVar10 = archive_entry_uid(local_18);
    archive_le32enc(pvVar19,(uint32_t)iVar10);
    pvVar19 = (void *)((long)&(local_c8->archive).vtable + 3);
    *(undefined1 *)((long)&(local_c8->archive).vtable + 2) = 4;
    iVar10 = archive_entry_gid(local_18);
    archive_le32enc(pvVar19,(uint32_t)iVar10);
    paVar23 = (archive_write *)((long)&(local_c8->archive).vtable + 7);
    puVar1[0xb] = puVar1[0xf];
    puVar16 = cd_alloc((zip_conflict *)in_stack_fffffffffffffe58,
                       CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    memcpy(puVar16,&local_b8,(long)paVar23 - (long)&local_b8);
    if (*(int *)((long)puVar1 + 0x44) != 0) {
      *(undefined4 *)paVar23 = 0x100001;
      archive_le64enc((void *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                      (uint64_t)in_stack_fffffffffffffe48);
      archive_le64enc((void *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                      (uint64_t)in_stack_fffffffffffffe48);
      puVar18 = (undefined4 *)((long)&(local_c8->archive).compression_code + 3);
      archive_le16enc((void *)((long)&(local_c8->archive).archive_format + 1),
                      (short)puVar18 - ((short)paVar23 + 4));
      paVar23 = (archive_write *)puVar18;
    }
    local_c8 = paVar23;
    if ((*(uint *)(puVar1 + 0x15) & 4) != 0) {
      *(undefined4 *)local_c8 = 0x6c65;
      *(undefined1 *)((long)local_c8 + 4) = 7;
      archive_le16enc((void *)((long)local_c8 + 5),local_108 + 0x300);
      archive_le16enc((void *)((long)local_c8 + 7),0);
      pvVar19 = (void *)((long)local_c8 + 9);
      mVar4 = archive_entry_mode((archive_entry *)puVar1[6]);
      archive_le32enc(pvVar19,mVar4 << 0x10);
      archive_le16enc((void *)((long)local_c8 + 2),
                      (short)(undefined4 *)((long)local_c8 + 0xd) - ((short)local_c8 + 4));
      local_c8 = (archive_write *)((long)local_c8 + 0xd);
    }
    archive_le16enc(auStack_1c,(short)local_c8 - (short)&local_b8);
    iVar7 = __archive_write_output
                      ((archive_write *)
                       CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       in_stack_fffffffffffffe48,0x190d13);
    if (iVar7 == 0) {
      puVar1[0x11] = puVar1[0x11] + 0x1e;
      iVar7 = write_path(paVar11,in_stack_fffffffffffffe80);
      if (iVar7 < 1) {
        local_4 = -0x1e;
      }
      else {
        puVar1[0x11] = (long)iVar7 + puVar1[0x11];
        iVar7 = __archive_write_output
                          ((archive_write *)
                           CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                           in_stack_fffffffffffffe48,0x190dce);
        if (iVar7 == 0) {
          puVar1[0x11] = (long)local_c8 + (puVar1[0x11] - (long)&local_b8);
          if (__s != (char *)0x0) {
            iVar7 = __archive_write_output
                              ((archive_write *)
                               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                               in_stack_fffffffffffffe48,0x190e44);
            if (iVar7 != 0) {
              return -0x1e;
            }
            puVar1[3] = sVar24 + puVar1[3];
            puVar1[4] = sVar24 + puVar1[4];
            puVar1[0x11] = sVar24 + puVar1[0x11];
          }
          if (*(int *)((long)puVar1 + 0x3c) == 8) {
            puVar1[0x1e] = 0;
            puVar1[0x1f] = 0;
            puVar1[0x20] = 0;
            puVar1[0x19] = puVar1[0x25];
            *(int *)(puVar1 + 0x1a) = (int)puVar1[0x24];
            iVar7 = deflateInit2_(puVar1 + 0x16,0xffffffff,8,0xfffffff1,8,0,"1.2.11",0x70);
            if (iVar7 != 0) {
              archive_set_error(local_10,0xc,"Can\'t init deflate compressor");
              return -0x1e;
            }
          }
          local_4 = local_f8;
        }
        else {
          local_4 = -0x1e;
        }
      }
    }
    else {
      local_4 = -0x1e;
    }
  }
  return local_4;
}

Assistant:

static int
archive_write_zip_header(struct archive_write *a, struct archive_entry *entry)
{
	unsigned char local_header[32];
	unsigned char local_extra[128];
	struct zip *zip = a->format_data;
	unsigned char *e;
	unsigned char *cd_extra;
	size_t filename_length;
	const char *slink = NULL;
	size_t slink_size = 0;
	struct archive_string_conv *sconv = get_sconv(a, zip);
	int ret, ret2 = ARCHIVE_OK;
	int64_t size;
	mode_t type;
	int version_needed = 10;

	/* Ignore types of entries that we don't support. */
	type = archive_entry_filetype(entry);
	if (type != AE_IFREG && type != AE_IFDIR && type != AE_IFLNK) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Filetype not supported");
		return ARCHIVE_FAILED;
	};

	/* If we're not using Zip64, reject large files. */
	if (zip->flags & ZIP_FLAG_AVOID_ZIP64) {
		/* Reject entries over 4GB. */
		if (archive_entry_size_is_set(entry)
		    && (archive_entry_size(entry) > 0xffffffff)) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Files > 4GB require Zip64 extensions");
			return ARCHIVE_FAILED;
		}
		/* Reject entries if archive is > 4GB. */
		if (zip->written_bytes > 0xffffffff) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Archives > 4GB require Zip64 extensions");
			return ARCHIVE_FAILED;
		}
	}

	/* Only regular files can have size > 0. */
	if (type != AE_IFREG)
		archive_entry_set_size(entry, 0);


	/* Reset information from last entry. */
	zip->entry_offset = zip->written_bytes;
	zip->entry_uncompressed_limit = INT64_MAX;
	zip->entry_compressed_size = 0;
	zip->entry_uncompressed_size = 0;
	zip->entry_compressed_written = 0;
	zip->entry_uncompressed_written = 0;
	zip->entry_flags = 0;
	zip->entry_uses_zip64 = 0;
	zip->entry_crc32 = zip->crc32func(0, NULL, 0);
	if (zip->entry != NULL) {
		archive_entry_free(zip->entry);
		zip->entry = NULL;
	}

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pahtname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	zip->entry = __la_win_entry_in_posix_pathseparator(entry);
	if (zip->entry == entry)
		zip->entry = archive_entry_clone(entry);
#else
	zip->entry = archive_entry_clone(entry);
#endif
	if (zip->entry == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate zip header data");
		return (ARCHIVE_FATAL);
	}

	if (sconv != NULL) {
		const char *p;
		size_t len;

		if (archive_entry_pathname_l(entry, &p, &len, sconv) != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Pathname");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Can't translate Pathname '%s' to %s",
			    archive_entry_pathname(entry),
			    archive_string_conversion_charset_name(sconv));
			ret2 = ARCHIVE_WARN;
		}
		if (len > 0)
			archive_entry_set_pathname(zip->entry, p);

		/*
		 * There is no standard for symlink handling; we convert
		 * it using the same character-set translation that we use
		 * for filename.
		 */
		if (type == AE_IFLNK) {
			if (archive_entry_symlink_l(entry, &p, &len, sconv)) {
				if (errno == ENOMEM) {
					archive_set_error(&a->archive, ENOMEM,
					    "Can't allocate memory "
					    " for Symlink");
					return (ARCHIVE_FATAL);
				}
				/* No error if we can't convert. */
			} else if (len > 0)
				archive_entry_set_symlink(zip->entry, p);
		}
	}

	/* If filename isn't ASCII and we can use UTF-8, set the UTF-8 flag. */
	if (!is_all_ascii(archive_entry_pathname(zip->entry))) {
		if (zip->opt_sconv != NULL) {
			if (strcmp(archive_string_conversion_charset_name(
					zip->opt_sconv), "UTF-8") == 0)
				zip->entry_flags |= ZIP_ENTRY_FLAG_UTF8_NAME;
#if HAVE_NL_LANGINFO
		} else if (strcmp(nl_langinfo(CODESET), "UTF-8") == 0) {
			zip->entry_flags |= ZIP_ENTRY_FLAG_UTF8_NAME;
#endif
		}
	}
	filename_length = path_length(zip->entry);

	/* Determine appropriate compression and size for this entry. */
	if (type == AE_IFLNK) {
		slink = archive_entry_symlink(zip->entry);
		if (slink != NULL)
			slink_size = strlen(slink);
		else
			slink_size = 0;
		zip->entry_uncompressed_limit = slink_size;
		zip->entry_compressed_size = slink_size;
		zip->entry_uncompressed_size = slink_size;
		zip->entry_crc32 = zip->crc32func(zip->entry_crc32,
		    (const unsigned char *)slink, slink_size);
		zip->entry_compression = COMPRESSION_STORE;
		version_needed = 20;
	} else if (type != AE_IFREG) {
		zip->entry_compression = COMPRESSION_STORE;
		zip->entry_uncompressed_limit = 0;
		size = 0;
		version_needed = 20;
	} else if (archive_entry_size_is_set(zip->entry)) {
		size = archive_entry_size(zip->entry);
		zip->entry_uncompressed_limit = size;
		zip->entry_compression = zip->requested_compression;
		if (zip->entry_compression == COMPRESSION_UNSPECIFIED) {
			zip->entry_compression = COMPRESSION_DEFAULT;
		}
		if (zip->entry_compression == COMPRESSION_STORE) {
			zip->entry_compressed_size = size;
			zip->entry_uncompressed_size = size;
			version_needed = 10;
		} else {
			zip->entry_uncompressed_size = size;
			version_needed = 20;
		}
		if ((zip->flags & ZIP_FLAG_FORCE_ZIP64) /* User asked. */
		    || (zip->entry_uncompressed_size > 0xffffffffLL)) { /* Large entry. */
			zip->entry_uses_zip64 = 1;
			version_needed = 45;
		}

		/* We may know the size, but never the CRC. */
		zip->entry_flags |= ZIP_ENTRY_FLAG_LENGTH_AT_END;
	} else {
		/* Prefer deflate if it's available, because deflate
		 * has a clear end-of-data marker that makes
		 * length-at-end more reliable. */
		zip->entry_compression = COMPRESSION_DEFAULT;
		zip->entry_flags |= ZIP_ENTRY_FLAG_LENGTH_AT_END;
		if ((zip->flags & ZIP_FLAG_AVOID_ZIP64) == 0) {
			zip->entry_uses_zip64 = 1;
			version_needed = 45;
		} else if (zip->entry_compression == COMPRESSION_STORE) {
			version_needed = 10;
		} else {
			version_needed = 20;
		}
	}

	/* Format the local header. */
	memset(local_header, 0, sizeof(local_header));
	memcpy(local_header, "PK\003\004", 4);
	archive_le16enc(local_header + 4, version_needed);
	archive_le16enc(local_header + 6, zip->entry_flags);
	archive_le16enc(local_header + 8, zip->entry_compression);
	archive_le32enc(local_header + 10, dos_time(archive_entry_mtime(zip->entry)));
	archive_le32enc(local_header + 14, zip->entry_crc32);
	if (zip->entry_uses_zip64) {
		/* Zip64 data in the local header "must" include both
		 * compressed and uncompressed sizes AND those fields
		 * are included only if these are 0xffffffff;
		 * THEREFORE these must be set this way, even if we
		 * know one of them is smaller. */
		archive_le32enc(local_header + 18, 0xffffffffLL);
		archive_le32enc(local_header + 22, 0xffffffffLL);
	} else {
		archive_le32enc(local_header + 18, zip->entry_compressed_size);
		archive_le32enc(local_header + 22, zip->entry_uncompressed_size);
	}
	archive_le16enc(local_header + 26, filename_length);

	/* Format as much of central directory file header as we can: */
	zip->file_header = cd_alloc(zip, 46);
	/* If (zip->file_header == NULL) XXXX */
	++zip->central_directory_entries;
	memset(zip->file_header, 0, 46);
	memcpy(zip->file_header, "PK\001\002", 4);
	/* "Made by PKZip 2.0 on Unix." */
	archive_le16enc(zip->file_header + 4, 3 * 256 + version_needed);
	archive_le16enc(zip->file_header + 6, version_needed);
	archive_le16enc(zip->file_header + 8, zip->entry_flags);
	archive_le16enc(zip->file_header + 10, zip->entry_compression);
	archive_le32enc(zip->file_header + 12, dos_time(archive_entry_mtime(zip->entry)));
	archive_le16enc(zip->file_header + 28, filename_length);
	/* Following Info-Zip, store mode in the "external attributes" field. */
	archive_le32enc(zip->file_header + 38,
	    archive_entry_mode(zip->entry) << 16);
	e = cd_alloc(zip, filename_length);
	/* If (e == NULL) XXXX */
	copy_path(zip->entry, e);

	/* Format extra data. */
	memset(local_extra, 0, sizeof(local_extra));
	e = local_extra;

	/* First, extra blocks that are the same between
	 * the local file header and the central directory.
	 * We format them once and then duplicate them. */

	/* UT timestamp, length depends on what timestamps are set. */
	memcpy(e, "UT", 2);
	archive_le16enc(e + 2,
	    1
	    + (archive_entry_mtime_is_set(entry) ? 4 : 0)
	    + (archive_entry_atime_is_set(entry) ? 4 : 0)
	    + (archive_entry_ctime_is_set(entry) ? 4 : 0));
	e += 4;
	*e++ =
	    (archive_entry_mtime_is_set(entry) ? 1 : 0)
	    | (archive_entry_atime_is_set(entry) ? 2 : 0)
	    | (archive_entry_ctime_is_set(entry) ? 4 : 0);
	if (archive_entry_mtime_is_set(entry)) {
		archive_le32enc(e, (uint32_t)archive_entry_mtime(entry));
		e += 4;
	}
	if (archive_entry_atime_is_set(entry)) {
		archive_le32enc(e, (uint32_t)archive_entry_atime(entry));
		e += 4;
	}
	if (archive_entry_ctime_is_set(entry)) {
		archive_le32enc(e, (uint32_t)archive_entry_ctime(entry));
		e += 4;
	}

	/* ux Unix extra data, length 11, version 1 */
	/* TODO: If uid < 64k, use 2 bytes, ditto for gid. */
	memcpy(e, "ux\013\000\001", 5);
	e += 5;
	*e++ = 4; /* Length of following UID */
	archive_le32enc(e, (uint32_t)archive_entry_uid(entry));
	e += 4;
	*e++ = 4; /* Length of following GID */
	archive_le32enc(e, (uint32_t)archive_entry_gid(entry));
	e += 4;

	/* Copy UT and ux into central directory as well. */
	zip->file_header_extra_offset = zip->central_directory_bytes;
	cd_extra = cd_alloc(zip, e - local_extra);
	memcpy(cd_extra, local_extra, e - local_extra);

	/*
	 * Following extra blocks vary between local header and
	 * central directory. These are the local header versions.
	 * Central directory versions get formatted in
	 * archive_write_zip_finish_entry() below.
	 */

	/* "[Zip64 entry] in the local header MUST include BOTH
	 * original [uncompressed] and compressed size fields." */
	if (zip->entry_uses_zip64) {
		unsigned char *zip64_start = e;
		memcpy(e, "\001\000\020\000", 4);
		e += 4;
		archive_le64enc(e, zip->entry_uncompressed_size);
		e += 8;
		archive_le64enc(e, zip->entry_compressed_size);
		e += 8;
		archive_le16enc(zip64_start + 2, e - (zip64_start + 4));
	}

	if (zip->flags & ZIP_FLAG_EXPERIMENT_EL) {
		/* Experimental 'el' extension to improve streaming. */
		unsigned char *external_info = e;
		int included = 7;
		memcpy(e, "el\000\000", 4); // 0x6c65 + 2-byte length
		e += 4;
		e[0] = included; /* bitmap of included fields */
		e += 1;
		if (included & 1) {
			archive_le16enc(e, /* "Version created by" */
			    3 * 256 + version_needed);
			e += 2;
		}
		if (included & 2) {
			archive_le16enc(e, 0); /* internal file attributes */
			e += 2;
		}
		if (included & 4) {
			archive_le32enc(e,  /* external file attributes */
			    archive_entry_mode(zip->entry) << 16);
			e += 4;
		}
		if (included & 8) {
			// Libarchive does not currently support file comments.
		}
		archive_le16enc(external_info + 2, e - (external_info + 4));
	}

	/* Update local header with size of extra data and write it all out: */
	archive_le16enc(local_header + 28, e - local_extra);

	ret = __archive_write_output(a, local_header, 30);
	if (ret != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	zip->written_bytes += 30;

	ret = write_path(zip->entry, a);
	if (ret <= ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	zip->written_bytes += ret;

	ret = __archive_write_output(a, local_extra, e - local_extra);
	if (ret != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	zip->written_bytes += e - local_extra;

	/* For symlinks, write the body now. */
	if (slink != NULL) {
		ret = __archive_write_output(a, slink, slink_size);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		zip->entry_compressed_written += slink_size;
		zip->entry_uncompressed_written += slink_size;
		zip->written_bytes += slink_size;
	}

#ifdef HAVE_ZLIB_H
	if (zip->entry_compression == COMPRESSION_DEFLATE) {
		zip->stream.zalloc = Z_NULL;
		zip->stream.zfree = Z_NULL;
		zip->stream.opaque = Z_NULL;
		zip->stream.next_out = zip->buf;
		zip->stream.avail_out = (uInt)zip->len_buf;
		if (deflateInit2(&zip->stream, Z_DEFAULT_COMPRESSION,
		    Z_DEFLATED, -15, 8, Z_DEFAULT_STRATEGY) != Z_OK) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't init deflate compressor");
			return (ARCHIVE_FATAL);
		}
	}
#endif

	return (ret2);
}